

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  bool bVar1;
  sqlite3_tokenizer **ppsVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  Fts3HashElem *pFVar8;
  sqlite3_tokenizer_module *psVar9;
  char **ppcVar10;
  char **p;
  long lVar11;
  int iVar12;
  int n;
  int local_54;
  char *local_50;
  char **local_48;
  sqlite3_tokenizer_module *local_40;
  sqlite3_tokenizer **local_38;
  
  local_54 = 0;
  __s = sqlite3_mprintf("%s");
  iVar12 = 7;
  if (__s != (char *)0x0) {
    local_38 = ppTok;
    sVar5 = strlen(__s);
    pcVar6 = sqlite3Fts3NextToken(__s,&local_54);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = __s;
    }
    lVar11 = (long)local_54;
    pcVar6[lVar11] = '\0';
    sqlite3Fts3Dequote(pcVar6);
    sVar7 = strlen(pcVar6);
    pFVar8 = sqlite3Fts3HashFindElem(pHash,pcVar6,(int)sVar7 + 1);
    if (pFVar8 == (Fts3HashElem *)0x0) {
      psVar9 = (sqlite3_tokenizer_module *)0x0;
    }
    else {
      psVar9 = (sqlite3_tokenizer_module *)pFVar8->data;
    }
    if (psVar9 == (sqlite3_tokenizer_module *)0x0) {
      sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",pcVar6);
      iVar12 = 1;
    }
    else {
      pcVar6 = pcVar6 + lVar11;
      p = (char **)0x0;
      iVar12 = 0;
      local_50 = __s;
      local_48 = pzErr;
      local_40 = psVar9;
      while ((pcVar6 + 1 < __s + sVar5 &&
             (pcVar6 = sqlite3Fts3NextToken(pcVar6 + 1,&local_54), pcVar6 != (char *)0x0))) {
        iVar3 = sqlite3_initialize();
        if (iVar3 == 0) {
          ppcVar10 = (char **)sqlite3Realloc(p,(long)(iVar12 + 1) << 3);
        }
        else {
          ppcVar10 = (char **)0x0;
        }
        if (ppcVar10 == (char **)0x0) {
          sqlite3_free(local_50);
          sqlite3_free(p);
          bVar1 = false;
          __s = local_50;
          goto LAB_001bbfd7;
        }
        ppcVar10[iVar12] = pcVar6;
        lVar11 = (long)local_54;
        pcVar6[lVar11] = '\0';
        sqlite3Fts3Dequote(pcVar6);
        pcVar6 = pcVar6 + lVar11;
        p = ppcVar10;
        iVar12 = iVar12 + 1;
      }
      ppsVar2 = local_38;
      psVar9 = local_40;
      uVar4 = (*local_40->xCreate)(iVar12,p,local_38);
      pcVar6 = (char *)(ulong)uVar4;
      if (uVar4 == 0) {
        (*ppsVar2)->pModule = psVar9;
      }
      else {
        sqlite3Fts3ErrMsg(local_48,"unknown tokenizer");
      }
      __s = local_50;
      sqlite3_free(p);
      bVar1 = true;
LAB_001bbfd7:
      iVar12 = (int)pcVar6;
      if (!bVar1) {
        return 7;
      }
    }
    sqlite3_free(__s);
  }
  return iVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      sqlite3_int64 nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc64((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}